

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minunit.h
# Opt level: O0

double mu_timer_cpu(void)

{
  int iVar1;
  long lVar2;
  clock_t cVar3;
  clock_t cl;
  tms tms;
  double ticks;
  rusage rusage;
  timespec ts;
  double dStack_10;
  clockid_t id;
  
  iVar1 = clock_gettime(2,(timespec *)&rusage.field_15);
  if (iVar1 == -1) {
    iVar1 = getrusage(RUSAGE_SELF,(rusage *)&ticks);
    if (iVar1 == -1) {
      lVar2 = sysconf(2);
      tms.tms_cstime = (clock_t)(double)lVar2;
      cVar3 = times((tms *)&cl);
      if (cVar3 == -1) {
        cVar3 = clock();
        if (cVar3 == -1) {
          dStack_10 = -1.0;
        }
        else {
          dStack_10 = (double)cVar3 / 1000000.0;
        }
      }
      else {
        dStack_10 = (double)cl / (double)tms.tms_cstime;
      }
    }
    else {
      dStack_10 = (double)(long)ticks + (double)rusage.ru_utime.tv_sec / 1000000.0;
    }
  }
  else {
    dStack_10 = (double)rusage.field_15.ru_nivcsw + (double)ts.tv_sec / 1000000000.0;
  }
  return dStack_10;
}

Assistant:

static double mu_timer_cpu(void) {
#if defined(_WIN32)
  /* Windows -------------------------------------------------- */
  FILETIME createTime;
  FILETIME exitTime;
  FILETIME kernelTime;
  FILETIME userTime;

  /* This approach has a resolution of 1/64 second. Unfortunately, Windows' API
   * does not offer better */
  if (GetProcessTimes(GetCurrentProcess(), &createTime, &exitTime, &kernelTime,
                      &userTime) != 0) {
    ULARGE_INTEGER userSystemTime;
    memcpy(&userSystemTime, &userTime, sizeof(ULARGE_INTEGER));
    return (double)userSystemTime.QuadPart / 10000000.0;
  }

#elif defined(__unix__) || defined(__unix) || defined(unix) ||                 \
    (defined(__APPLE__) && defined(__MACH__))
  /* AIX, BSD, Cygwin, HP-UX, Linux, OSX, and Solaris --------- */

#if defined(_POSIX_TIMERS) && (_POSIX_TIMERS > 0)
  /* Prefer high-res POSIX timers, when available. */
  {
    clockid_t id;
    struct timespec ts;
#if _POSIX_CPUTIME > 0
    /* Clock ids vary by OS.  Query the id, if possible. */
    if (clock_getcpuclockid(0, &id) == -1)
#endif
#if defined(CLOCK_PROCESS_CPUTIME_ID)
      /* Use known clock id for AIX, Linux, or Solaris. */
      id = CLOCK_PROCESS_CPUTIME_ID;
#elif defined(CLOCK_VIRTUAL)
    /* Use known clock id for BSD or HP-UX. */
    id = CLOCK_VIRTUAL;
#else
    id = (clockid_t)-1;
#endif
    if (id != (clockid_t)-1 && clock_gettime(id, &ts) != -1)
      return (double)ts.tv_sec + (double)ts.tv_nsec / 1000000000.0;
  }
#endif

#if defined(RUSAGE_SELF)
  {
    struct rusage rusage;
    if (getrusage(RUSAGE_SELF, &rusage) != -1)
      return (double)rusage.ru_utime.tv_sec +
             (double)rusage.ru_utime.tv_usec / 1000000.0;
  }
#endif

#if defined(_SC_CLK_TCK)
  {
    const double ticks = (double)sysconf(_SC_CLK_TCK);
    struct tms tms;
    if (times(&tms) != (clock_t)-1)
      return (double)tms.tms_utime / ticks;
  }
#endif

#if defined(CLOCKS_PER_SEC)
  {
    clock_t cl = clock();
    if (cl != (clock_t)-1)
      return (double)cl / (double)CLOCKS_PER_SEC;
  }
#endif

#endif

  return -1; /* Failed. */
}